

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<ProjectBuilderSubDirs_*>::clear(QList<ProjectBuilderSubDirs_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<ProjectBuilderSubDirs_*> *this_00;
  __off_t __length;
  QArrayDataPointer<ProjectBuilderSubDirs_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<ProjectBuilderSubDirs_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<ProjectBuilderSubDirs_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<ProjectBuilderSubDirs_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<ProjectBuilderSubDirs_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<ProjectBuilderSubDirs_*>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<ProjectBuilderSubDirs_*> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<ProjectBuilderSubDirs_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<ProjectBuilderSubDirs_*>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<ProjectBuilderSubDirs_*>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<ProjectBuilderSubDirs_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<ProjectBuilderSubDirs_*> *)
                QArrayDataPointer<ProjectBuilderSubDirs_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<ProjectBuilderSubDirs_*>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }